

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O2

void __thiscall
fmt::internal::BasicArgFormatter<fmt::internal::ArgFormatter<char>,_char>::visit_char
          (BasicArgFormatter<fmt::internal::ArgFormatter<char>,_char> *this,int value)

{
  byte bVar1;
  Alignment AVar2;
  FormatSpec *pFVar3;
  uint uVar4;
  CharPtr __s;
  FormatError *this_00;
  size_t __len;
  char __tmp;
  ulong uVar5;
  size_t __len_1;
  ulong __n;
  size_t __len_2;
  size_t __n_00;
  
  pFVar3 = this->spec_;
  if ((pFVar3->type_ != '\0') && (pFVar3->type_ != 'c')) {
    *(byte *)&pFVar3->flags_ = (byte)pFVar3->flags_ | 0x10;
    BasicWriter<char>::write_int<int,fmt::FormatSpec>(this->writer_,value,*pFVar3);
    return;
  }
  if (((pFVar3->super_AlignSpec).align_ == ALIGN_NUMERIC) || (pFVar3->flags_ != 0)) {
    this_00 = (FormatError *)__cxa_allocate_exception(0x10);
    FormatError::FormatError(this_00,(CStringRef)0x20b757);
    __cxa_throw(this_00,&FormatError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar5 = (ulong)(pFVar3->super_AlignSpec).super_WidthSpec.width_;
  if (uVar5 < 2) {
    __s = BasicWriter<char>::grow_buffer(this->writer_,1);
    goto LAB_001deb55;
  }
  bVar1 = (byte)(pFVar3->super_AlignSpec).super_WidthSpec.fill_;
  __s = BasicWriter<char>::grow_buffer(this->writer_,uVar5);
  uVar4 = (this->spec_->super_AlignSpec).super_WidthSpec.width_;
  AVar2 = (this->spec_->super_AlignSpec).align_;
  if (AVar2 == ALIGN_CENTER) {
    uVar5 = (ulong)uVar4 - 1;
    __n = uVar5 >> 1;
    if (1 < uVar5) {
      memset(__s,(uint)bVar1,__n);
    }
    __s = __s + __n;
    if (uVar4 == 1) goto LAB_001deb55;
    __n_00 = uVar5 - __n;
  }
  else {
    if (AVar2 == ALIGN_RIGHT) {
      if (uVar4 - 1 == 0) {
        uVar4 = 0;
      }
      else {
        memset(__s,(uint)bVar1,(ulong)(uVar4 - 1));
        uVar4 = (this->spec_->super_AlignSpec).super_WidthSpec.width_ - 1;
      }
      __s = __s + uVar4;
      goto LAB_001deb55;
    }
    if (uVar4 - 1 == 0) goto LAB_001deb55;
    __n_00 = (size_t)(uVar4 - 1);
  }
  memset(__s + 1,(uint)bVar1,__n_00);
LAB_001deb55:
  *__s = (char)value;
  return;
}

Assistant:

void visit_char(int value) {
    if (spec_.type_ && spec_.type_ != 'c') {
      spec_.flags_ |= CHAR_FLAG;
      writer_.write_int(value, spec_);
      return;
    }
    if (spec_.align_ == ALIGN_NUMERIC || spec_.flags_ != 0)
      FMT_THROW(FormatError("invalid format specifier for char"));
    typedef typename BasicWriter<Char>::CharPtr CharPtr;
    Char fill = internal::CharTraits<Char>::cast(spec_.fill());
    CharPtr out = CharPtr();
    const unsigned char_width = 1;
    if (spec_.width_ > char_width) {
      out = writer_.grow_buffer(spec_.width_);
      if (spec_.align_ == ALIGN_RIGHT) {
        std::fill_n(out, spec_.width_ - char_width, fill);
        out += spec_.width_ - char_width;
      } else if (spec_.align_ == ALIGN_CENTER) {
        out = writer_.fill_padding(out, spec_.width_,
                                   internal::check(char_width), fill);
      } else {
        std::fill_n(out + char_width, spec_.width_ - char_width, fill);
      }
    } else {
      out = writer_.grow_buffer(char_width);
    }
    *out = internal::CharTraits<Char>::cast(value);
  }